

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_MLABecLaplacian.cpp
# Opt level: O0

bool __thiscall amrex::MLABecLaplacian::supportNSolve(MLABecLaplacian *this)

{
  bool bVar1;
  const_reference this_00;
  size_type in_RDI;
  int in_stack_00000008;
  int in_stack_0000000c;
  bool support;
  uint7 in_stack_fffffffffffffff0;
  byte bVar2;
  
  bVar2 = 0;
  Vector<amrex::Vector<std::unique_ptr<amrex::iMultiFab,_std::default_delete<amrex::iMultiFab>_>,_std::allocator<std::unique_ptr<amrex::iMultiFab,_std::default_delete<amrex::iMultiFab>_>_>_>,_std::allocator<amrex::Vector<std::unique_ptr<amrex::iMultiFab,_std::default_delete<amrex::iMultiFab>_>,_std::allocator<std::unique_ptr<amrex::iMultiFab,_std::default_delete<amrex::iMultiFab>_>_>_>_>_>
  ::operator[]((Vector<amrex::Vector<std::unique_ptr<amrex::iMultiFab,_std::default_delete<amrex::iMultiFab>_>,_std::allocator<std::unique_ptr<amrex::iMultiFab,_std::default_delete<amrex::iMultiFab>_>_>_>,_std::allocator<amrex::Vector<std::unique_ptr<amrex::iMultiFab,_std::default_delete<amrex::iMultiFab>_>,_std::allocator<std::unique_ptr<amrex::iMultiFab,_std::default_delete<amrex::iMultiFab>_>_>_>_>_>
                *)(ulong)in_stack_fffffffffffffff0,in_RDI);
  Vector<std::unique_ptr<amrex::iMultiFab,_std::default_delete<amrex::iMultiFab>_>,_std::allocator<std::unique_ptr<amrex::iMultiFab,_std::default_delete<amrex::iMultiFab>_>_>_>
  ::operator[]((Vector<std::unique_ptr<amrex::iMultiFab,_std::default_delete<amrex::iMultiFab>_>,_std::allocator<std::unique_ptr<amrex::iMultiFab,_std::default_delete<amrex::iMultiFab>_>_>_>
                *)CONCAT17(bVar2,in_stack_fffffffffffffff0),in_RDI);
  bVar1 = std::unique_ptr::operator_cast_to_bool
                    ((unique_ptr<amrex::iMultiFab,_std::default_delete<amrex::iMultiFab>_> *)
                     0x156c59b);
  if (bVar1) {
    Vector<amrex::Vector<amrex::Geometry,_std::allocator<amrex::Geometry>_>,_std::allocator<amrex::Vector<amrex::Geometry,_std::allocator<amrex::Geometry>_>_>_>
    ::operator[]((Vector<amrex::Vector<amrex::Geometry,_std::allocator<amrex::Geometry>_>,_std::allocator<amrex::Vector<amrex::Geometry,_std::allocator<amrex::Geometry>_>_>_>
                  *)CONCAT17(bVar2,in_stack_fffffffffffffff0),in_RDI);
    this_00 = std::vector<amrex::Geometry,_std::allocator<amrex::Geometry>_>::back
                        ((vector<amrex::Geometry,_std::allocator<amrex::Geometry>_> *)
                         CONCAT17(bVar2,in_stack_fffffffffffffff0));
    Geometry::Domain(this_00);
    bVar1 = Box::coarsenable((Box *)this,in_stack_0000000c,in_stack_00000008);
    if (bVar1) {
      Vector<amrex::Vector<amrex::BoxArray,_std::allocator<amrex::BoxArray>_>,_std::allocator<amrex::Vector<amrex::BoxArray,_std::allocator<amrex::BoxArray>_>_>_>
      ::operator[]((Vector<amrex::Vector<amrex::BoxArray,_std::allocator<amrex::BoxArray>_>,_std::allocator<amrex::Vector<amrex::BoxArray,_std::allocator<amrex::BoxArray>_>_>_>
                    *)CONCAT17(bVar2,in_stack_fffffffffffffff0),in_RDI);
      std::vector<amrex::BoxArray,_std::allocator<amrex::BoxArray>_>::back
                ((vector<amrex::BoxArray,_std::allocator<amrex::BoxArray>_> *)
                 CONCAT17(bVar2,in_stack_fffffffffffffff0));
      bVar1 = BoxArray::coarsenable((BoxArray *)this,in_stack_0000000c,in_stack_00000008);
      if (bVar1) {
        bVar2 = 1;
      }
    }
  }
  return (bool)(bVar2 & 1);
}

Assistant:

bool
MLABecLaplacian::supportNSolve () const
{
    bool support = false;
    if (m_overset_mask[0][0]) {
        if (m_geom[0].back().Domain().coarsenable(MLLinOp::mg_coarsen_ratio,
                                                  MLLinOp::mg_domain_min_width)
            && m_grids[0].back().coarsenable(MLLinOp::mg_coarsen_ratio, MLLinOp::mg_box_min_width))
        {
            support = true;
        }
    }
    return support;
}